

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int ixmlNode_isAncestor(IXML_Node_conflict *ancestorNode,IXML_Node_conflict *toFind)

{
  int local_24;
  int found;
  IXML_Node_conflict *toFind_local;
  IXML_Node_conflict *ancestorNode_local;
  
  local_24 = 0;
  if ((ancestorNode != (IXML_Node_conflict *)0x0) && (toFind != (IXML_Node_conflict *)0x0)) {
    if (toFind->parentNode == ancestorNode) {
      return 1;
    }
    local_24 = ixmlNode_isAncestor(ancestorNode->firstChild,toFind);
    if (local_24 == 0) {
      local_24 = ixmlNode_isAncestor(ancestorNode->nextSibling,toFind);
    }
  }
  return local_24;
}

Assistant:

static int ixmlNode_isAncestor(
	/*! [in] The candidate to ancestor \b Node. */
	IXML_Node *ancestorNode,
	/*! [in] The \b Node to check for an ancestor. */
	IXML_Node *toFind)
{
	int found = 0;

	if (ancestorNode != NULL && toFind != NULL) {
		if (toFind->parentNode == ancestorNode) {
			return 1;
		} else {
			found = ixmlNode_isAncestor(
				ancestorNode->firstChild, toFind);
			if (found == 0) {
				found = ixmlNode_isAncestor(
					ancestorNode->nextSibling, toFind);
			}
		}
	}

	return found;
}